

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeanLoader_impl.hpp
# Opt level: O1

A * __thiscall hiberlite::BeanLoader::loadBean<A>(BeanLoader *this,bean_key *key)

{
  _Rb_tree_header *p_Var1;
  int *piVar2;
  A *obj;
  bean_key local_40;
  
  obj = (A *)operator_new(0xb8);
  memset(obj,0,0xb8);
  (obj->s)._M_dataplus._M_p = (pointer)&(obj->s).field_2;
  (obj->s)._M_string_length = 0;
  (obj->s).field_2._M_local_buf[0] = '\0';
  (obj->vi).super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (obj->vi).super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (obj->vi).super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(obj->seti)._M_t._M_impl.super__Rb_tree_header;
  (obj->seti)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (obj->seti)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (obj->seti)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (obj->seti)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(obj->mm)._M_t._M_impl.super__Rb_tree_header;
  (obj->mm)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (obj->mm)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (obj->seti)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (obj->v).super__Vector_base<hiberlite::bean_ptr<B>,_std::allocator<hiberlite::bean_ptr<B>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (obj->v).super__Vector_base<hiberlite::bean_ptr<B>,_std::allocator<hiberlite::bean_ptr<B>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (obj->v).super__Vector_base<hiberlite::bean_ptr<B>,_std::allocator<hiberlite::bean_ptr<B>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (obj->mm)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (obj->mm)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (obj->mm)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_40.id = key->id;
  local_40.con._vptr_shared_res = (_func_int **)&PTR__shared_res_001d4578;
  local_40.con.res = (key->con).res;
  if (local_40.con.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
    (local_40.con.res)->refCount = (local_40.con.res)->refCount + 1;
  }
  AVisitor<hiberlite::LoadBean>::startWalk<A>
            (&this->super_AVisitor<hiberlite::LoadBean>,obj,&local_40);
  local_40.con._vptr_shared_res = (_func_int **)&PTR__shared_res_001d4578;
  if (local_40.con.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
    piVar2 = &(local_40.con.res)->refCount;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      (*(local_40.con.res)->_vptr_shared_cnt_obj_pair[1])();
    }
  }
  return obj;
}

Assistant:

C* BeanLoader::loadBean(bean_key key)
{
	C* bean;
	construct(*this, &bean, static_cast<unsigned int>(0));
	startWalk(*bean, key);
	return bean;
}